

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPSymmetricAlgorithm::checkMaximumBytes(OSSLEVPSymmetricAlgorithm *this,unsigned_long bytes)

{
  int iVar1;
  BIGNUM *a;
  ulong in_RSI;
  long in_RDI;
  bool rv;
  BIGNUM *bigNum;
  bool local_1;
  
  if (*(long *)(in_RDI + 0x68) == 0) {
    local_1 = true;
  }
  else {
    a = BN_new();
    BN_copy(a,*(BIGNUM **)(in_RDI + 0x70));
    BN_add_word(a,in_RSI);
    iVar1 = BN_cmp(*(BIGNUM **)(in_RDI + 0x68),a);
    local_1 = -1 < iVar1;
    BN_free(a);
  }
  return local_1;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::checkMaximumBytes(unsigned long bytes)
{
	if (maximumBytes == NULL) return true;

	BIGNUM* bigNum = BN_new();
	BN_copy(bigNum, counterBytes);
	BN_add_word(bigNum, bytes);

	bool rv = false;
	if (BN_cmp(maximumBytes, bigNum) >= 0) rv = true;

	BN_free(bigNum);

	return rv;
}